

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

uint64_t absl::lts_20240722::log_internal::anon_unknown_2::DecodeVarint(Span<const_char> *buf)

{
  size_type sVar1;
  byte *pbVar2;
  ulong uVar3;
  reference pcVar4;
  ulong local_20;
  size_t s;
  uint64_t value;
  Span<const_char> *buf_local;
  
  s = 0;
  local_20 = 0;
  do {
    sVar1 = Span<const_char>::size(buf);
    if (sVar1 <= local_20) break;
    pbVar2 = (byte *)Span<const_char>::operator[](buf,local_20);
    s = (long)(int)(*pbVar2 & 0x7f) << ((char)local_20 * '\a' & 0x3fU) | s;
    uVar3 = local_20 + 1;
    pcVar4 = Span<const_char>::operator[](buf,local_20);
    local_20 = uVar3;
  } while (((int)*pcVar4 & 0x80U) != 0);
  Span<const_char>::remove_prefix(buf,local_20);
  return s;
}

Assistant:

uint64_t DecodeVarint(absl::Span<const char> *buf) {
  uint64_t value = 0;
  size_t s = 0;
  while (s < buf->size()) {
    value |= static_cast<uint64_t>(static_cast<unsigned char>((*buf)[s]) & 0x7f)
             << 7 * s;
    if (!((*buf)[s++] & 0x80)) break;
  }
  buf->remove_prefix(s);
  return value;
}